

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void anon_unknown.dwarf_56e97::readScanlineThing<Imf_3_2::InputFile>(InputFile *input,bool test)

{
  int iVar1;
  Header *hdr;
  int *piVar2;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  FrameBuffer dummy;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> local_58;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_40;
  
  local_58.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  hdr = (Header *)Imf_3_2::InputFile::header();
  doFrameBuffer(&local_58,hdr,(FrameBuffer *)&local_40);
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)input);
  Imf_3_2::InputFile::header();
  piVar2 = (int *)Imf_3_2::Header::dataWindow();
  iVar1 = *piVar2;
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::InputFile::readPixels((int)input,iVar1);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_40);
  if (local_58.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
readScanlineThing (T& input, bool test)
{

    if (test && input.header ().hasType ())
    {
        if (input.header ().type () != SCANLINEIMAGE)
        {
            std::cerr << "tiled image/part didn't have tiledimage type\n";
            //assert(input.type()==TILEDIMAGE);
        }
    }

    vector<half> value;
    FrameBuffer  dummy;
    doFrameBuffer (value, input.header (), dummy);
    input.setFrameBuffer (dummy);
    input.readPixels (
        input.header ().dataWindow ().min.x,
        input.header ().dataWindow ().max.x);
}